

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O0

void testing::internal::ContainerPrinter::
     PrintValue<std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               (vector<unsigned_char,_std::allocator<unsigned_char>_> *container,ostream *os)

{
  bool bVar1;
  reference value;
  uchar *elem;
  const_iterator __end0;
  const_iterator __begin0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__range3;
  size_t count;
  size_t kMaxCount;
  ostream *os_local;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *container_local;
  
  std::operator<<(os,'{');
  __range3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0;
  __end0 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin(container);
  elem = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(container);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end0,(__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                                *)&elem);
    if (!bVar1) {
LAB_002a5625:
      if (__range3 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) {
        std::operator<<(os,' ');
      }
      std::operator<<(os,'}');
      return;
    }
    value = __gnu_cxx::
            __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            ::operator*(&__end0);
    if ((__range3 != (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x0) &&
       (std::operator<<(os,','),
       __range3 == (vector<unsigned_char,_std::allocator<unsigned_char>_> *)0x20)) {
      std::operator<<(os," ...");
      goto LAB_002a5625;
    }
    std::operator<<(os,' ');
    UniversalPrint<unsigned_char>(value,os);
    __range3 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
               ((long)&(__range3->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)
                       ._M_impl.super__Vector_impl_data._M_start + 1);
    __gnu_cxx::
    __normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::operator++(&__end0);
  } while( true );
}

Assistant:

static void PrintValue(const T& container, std::ostream* os) {
    const size_t kMaxCount = 32;  // The maximum number of elements to print.
    *os << '{';
    size_t count = 0;
    for (auto&& elem : container) {
      if (count > 0) {
        *os << ',';
        if (count == kMaxCount) {  // Enough has been printed.
          *os << " ...";
          break;
        }
      }
      *os << ' ';
      // We cannot call PrintTo(elem, os) here as PrintTo() doesn't
      // handle `elem` being a native array.
      internal::UniversalPrint(elem, os);
      ++count;
    }

    if (count > 0) {
      *os << ' ';
    }
    *os << '}';
  }